

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall QPDF::updateAllPagesCache(QPDF *this)

{
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::clear
            (&((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->all_pages);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::clear(&(((this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pageobj_to_pages_pos)._M_t
         );
  ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pushed_inherited_attributes_to_pages
       = false;
  getAllPages(this);
  return;
}

Assistant:

void
QPDF::updateAllPagesCache()
{
    // Force regeneration of the pages cache.  We force immediate recalculation of all_pages since
    // users may have references to it that they got from calls to getAllPages().  We can defer
    // recalculation of pageobj_to_pages_pos until needed.
    QTC::TC("qpdf", "QPDF updateAllPagesCache");
    m->all_pages.clear();
    m->pageobj_to_pages_pos.clear();
    m->pushed_inherited_attributes_to_pages = false;
    getAllPages();
}